

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Str_Ntk_t * Str_ManNormalizeInt(Gia_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pObj_00;
  bool bVar8;
  int local_38;
  int local_34;
  int iFanin;
  int i;
  Gia_Obj_t *pObj;
  Str_Ntk_t *pNtk;
  Vec_Int_t *vRoots_local;
  Vec_Wec_t *vGroups_local;
  Gia_Man_t *p_local;
  
  pNtk = (Str_Ntk_t *)vRoots;
  vRoots_local = (Vec_Int_t *)vGroups;
  vGroups_local = (Vec_Wec_t *)p;
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x2dd,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar6 = Vec_IntAlloc(100);
    *(Vec_Int_t **)(vGroups_local + 0x3a) = pVVar6;
  }
  if (vGroups_local[0x3a].pArray == (Vec_Int_t *)0x0) {
    pVVar6 = Vec_IntAlloc(100);
    vGroups_local[0x3a].pArray = pVVar6;
  }
  Gia_ManFillValue((Gia_Man_t *)vGroups_local);
  iVar1 = Gia_ManObjNum((Gia_Man_t *)vGroups_local);
  iVar2 = Gia_ManCoNum((Gia_Man_t *)vGroups_local);
  iVar3 = Gia_ManAndNum((Gia_Man_t *)vGroups_local);
  iVar4 = Gia_ManMuxNum((Gia_Man_t *)vGroups_local);
  pObj = (Gia_Obj_t *)Str_NtkCreate(iVar1,iVar2 + 1 + iVar3 * 2 + iVar4);
  pGVar7 = Gia_ManConst0((Gia_Man_t *)vGroups_local);
  pGVar7->Value = 0;
  local_34 = 1;
  while( true ) {
    bVar8 = false;
    if (local_34 < *(int *)&vGroups_local[1].pArray) {
      _iFanin = Gia_ManObj((Gia_Man_t *)vGroups_local,local_34);
      bVar8 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjIsCi(_iFanin);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_iFanin);
      p_00 = vGroups_local;
      pGVar7 = pObj;
      if (iVar1 != 0) {
        pObj_00 = Gia_ObjFanin0(_iFanin);
        Str_ManNormalize_rec
                  ((Str_Ntk_t *)pGVar7,(Gia_Man_t *)p_00,pObj_00,(Vec_Wec_t *)vRoots_local,
                   (Vec_Int_t *)pNtk);
        local_38 = Gia_ObjFanin0Copy(_iFanin);
        uVar5 = Str_ObjCreate((Str_Ntk_t *)pObj,7,1,&local_38);
        _iFanin->Value = uVar5;
      }
    }
    else {
      uVar5 = Str_ObjCreate((Str_Ntk_t *)pObj,2,0,(int *)0x0);
      _iFanin->Value = uVar5;
    }
    local_34 = local_34 + 1;
  }
  iVar1 = *(int *)pObj;
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vGroups_local);
  if (iVar2 < iVar1) {
    __assert_fail("pNtk->nObjs <= Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x2f0,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  return (Str_Ntk_t *)pObj;
}

Assistant:

Str_Ntk_t * Str_ManNormalizeInt( Gia_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    Str_Ntk_t * pNtk;
    Gia_Obj_t * pObj;
    int i, iFanin;
    assert( p->pMuxes != NULL );
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( STR_SUPER );
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( STR_SUPER );
    Gia_ManFillValue( p );
    pNtk = Str_NtkCreate( Gia_ManObjNum(p), 1 + Gia_ManCoNum(p) + 2 * Gia_ManAndNum(p) + Gia_ManMuxNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Str_ObjCreate( pNtk, STR_PI, 0, NULL );
        else if ( Gia_ObjIsCo(pObj) )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            iFanin = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Str_ObjCreate( pNtk, STR_PO, 1, &iFanin );
        }
    }
    assert( pNtk->nObjs <= Gia_ManObjNum(p) );
    return pNtk;
}